

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlCtxtReadMemory(xmlParserCtxtPtr ctxt,char *buffer,int size,char *URL,char *encoding,
                           int options)

{
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  if (-1 < size && ctxt != (xmlParserCtxtPtr)0x0) {
    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt,options);
    input = xmlCtxtNewInputFromMemory(ctxt,URL,buffer,(ulong)(uint)size,encoding,2);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtReadMemory(xmlParserCtxtPtr ctxt, const char *buffer, int size,
                  const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (size < 0))
        return(NULL);

    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromMemory(ctxt, URL, buffer, size, encoding,
                                      XML_INPUT_BUF_STATIC);
    if (input == NULL)
        return(NULL);

    return(xmlCtxtParseDocument(ctxt, input));
}